

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

void __thiscall gdsPATH::to_str(gdsPATH *this)

{
  ostream *poVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_14;
  uint i;
  gdsPATH *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"GDS PATH class:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  layer: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->layer);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  width: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->width);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  xCor:\tyCor:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_14 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->xCor);
    if (sVar2 <= local_14) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->xCor,(ulong)local_14);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar3);
    poVar1 = std::operator<<(poVar1,"\t");
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->xCor,(ulong)local_14);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar3);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void gdsPATH::to_str()
{
  cout << "GDS PATH class:" << endl;

  cout << "  layer: " << this->layer << endl;
  cout << "  width: " << this->width << endl;

  cout << "  xCor:\tyCor:" << endl;
  for (unsigned int i = 0; i < this->xCor.size(); i++) {
    cout << this->xCor[i] << "\t" << this->xCor[i] << endl;
  }
}